

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O2

ArgIface * __thiscall Args::Command::findArgument(Command *this,String *n)

{
  __type _Var1;
  Command *pCVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&bStack_38,this);
  _Var1 = std::operator==(&bStack_38,n);
  std::__cxx11::string::~string((string *)&bStack_38);
  pCVar2 = (Command *)0x0;
  if (_Var1) {
    pCVar2 = this;
  }
  return (ArgIface *)pCVar2;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & n ) override
	{
		if( name() == n )
			return this;
		else
			return nullptr;
	}